

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::namespace_uri(xpath_node *node)

{
  unspecified_bool_type p_Var1;
  xml_node in_RDI;
  xml_node unaff_retaddr;
  xml_attribute in_stack_00000008;
  xpath_node *in_stack_ffffffffffffffc8;
  char_t *local_30;
  xml_attribute local_10;
  
  local_10 = xpath_node::attribute((xpath_node *)in_RDI._root);
  p_Var1 = xml_attribute::operator_cast_to_function_pointer(&local_10);
  if (p_Var1 == (unspecified_bool_type)0x0) {
    xpath_node::node(in_stack_ffffffffffffffc8);
    local_30 = namespace_uri(in_RDI);
  }
  else {
    xpath_node::attribute((xpath_node *)in_RDI._root);
    xpath_node::parent(in_stack_ffffffffffffffc8);
    local_30 = namespace_uri(in_stack_00000008,unaff_retaddr);
  }
  return local_30;
}

Assistant:

PUGI_IMPL_FN const char_t* namespace_uri(const xpath_node& node)
	{
		return node.attribute() ? namespace_uri(node.attribute(), node.parent()) : namespace_uri(node.node());
	}